

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O0

int dlep_extension_radio_write_session_update
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  char *pcVar1;
  avl_tree *paVar2;
  long local_88;
  int result;
  oonf_layer2_net *l2net;
  oonf_layer2_neigh_key *neigh_local;
  dlep_session *session_local;
  dlep_extension *ext_local;
  
  pcVar1 = (session->l2_listener).name;
  paVar2 = oonf_layer2_get_net_tree();
  local_88 = avl_find(paVar2,pcVar1);
  if (local_88 == 0) {
    local_88 = 0;
  }
  else {
    local_88 = local_88 + -0x7a0;
  }
  if (local_88 == 0) {
    if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x163,0,0,
               "Could not find l2net for new interface");
    }
    ext_local._4_4_ = -1;
  }
  else {
    ext_local._4_4_ =
         dlep_writer_map_l2neigh_data
                   (&session->writer,ext,(oonf_layer2_data *)(local_88 + 0x390),
                    (oonf_layer2_data *)0x0);
    if (ext_local._4_4_ == 0) {
      ext_local._4_4_ =
           dlep_writer_map_l2net_data(&session->writer,ext,(oonf_layer2_data *)(local_88 + 0x110));
      if (ext_local._4_4_ == 0) {
        ext_local._4_4_ = 0;
      }
      else if (((&log_global_mask)[session->log_source] & 4) != 0) {
        oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x16f,0,0,
                 "tlv mapping for extension %d failed: %d",ext->id,ext_local._4_4_);
      }
    }
    else if (((&log_global_mask)[session->log_source] & 4) != 0) {
      oonf_log(4,session->log_source,"src/generic/dlep/dlep_extension.c",0x169,0,0,
               "tlv mapping for extension %d failed: %d",ext->id,ext_local._4_4_);
    }
  }
  return ext_local._4_4_;
}

Assistant:

int
dlep_extension_radio_write_session_update(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  struct oonf_layer2_net *l2net;
  int result;

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not find l2net for new interface");
    return -1;
  }

  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}